

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O2

void __thiscall antlr::CharScanner::traceIn(CharScanner *this,char *rname)

{
  int iVar1;
  ostream *poVar2;
  
  this->traceDepth = this->traceDepth + 1;
  (*(this->super_TokenStream)._vptr_TokenStream[0x2f])();
  poVar2 = std::operator<<((ostream *)&std::cout,"> lexer ");
  poVar2 = std::operator<<(poVar2,rname);
  poVar2 = std::operator<<(poVar2,"; c==");
  iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[3])(this,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void CharScanner::traceIn(const char* rname)
{
	traceDepth++;
	traceIndent();
	ANTLR_USE_NAMESPACE(std)cout << "> lexer " << rname
		<< "; c==" << LA(1) << ANTLR_USE_NAMESPACE(std)endl;
}